

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O3

MPP_RET test_ctx_init(MpiEncMultiCtxInfo *info)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  RK_U32 RVar7;
  RK_U32 RVar8;
  undefined4 uVar9;
  MpiEncTestArgs *pMVar10;
  undefined4 uVar11;
  char *__s1;
  RK_S32 RVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  int iVar15;
  MppFrameFormat MVar16;
  FILE *pFVar17;
  CamSource *pCVar18;
  MppFrameFormat MVar19;
  uint uVar20;
  uint uVar21;
  MppCodingType MVar22;
  MPP_RET MVar23;
  bool bVar24;
  ulong uVar25;
  ulong uVar26;
  
  pMVar10 = info->cmd;
  uVar9 = pMVar10->width;
  uVar11 = pMVar10->height;
  (info->ctx).width = uVar9;
  (info->ctx).height = uVar11;
  uVar25._0_4_ = pMVar10->hor_stride;
  uVar25._4_4_ = pMVar10->ver_stride;
  uVar26 = CONCAT44(-(uint)(uVar25._4_4_ == 0),-(uint)((undefined4)uVar25 == 0));
  uVar25 = CONCAT44(uVar11 + 0xf,uVar9 + 0xf) & uVar26 & (ulong)DAT_00116020 | ~uVar26 & uVar25;
  (info->ctx).hor_stride = (int)uVar25;
  (info->ctx).ver_stride = (int)(uVar25 >> 0x20);
  (info->ctx).fmt = pMVar10->format;
  MVar22 = pMVar10->type;
  (info->ctx).type = MVar22;
  uVar3 = pMVar10->rc_mode;
  uVar4 = pMVar10->bps_target;
  uVar5 = pMVar10->bps_max;
  uVar6 = pMVar10->bps_min;
  (info->ctx).bps = uVar4;
  (info->ctx).bps_max = uVar5;
  (info->ctx).bps_min = uVar6;
  (info->ctx).rc_mode = uVar3;
  iVar15 = pMVar10->frame_num;
  (info->ctx).frame_num = iVar15;
  if (MVar22 == MPP_VIDEO_CodingMJPEG && iVar15 == 0) {
    _mpp_log_l(4,"mpi_enc_test","jpege default encode only one frame. Use -n [num] for rc case\n",0)
    ;
    (info->ctx).frame_num = 1;
    MVar22 = pMVar10->type;
  }
  RVar12 = pMVar10->gop_len;
  (info->ctx).gop_mode = pMVar10->gop_mode;
  (info->ctx).gop_len = RVar12;
  (info->ctx).vi_len = pMVar10->vi_len;
  RVar12 = pMVar10->fps_in_num;
  RVar13 = pMVar10->fps_in_den;
  RVar14 = pMVar10->fps_out_flex;
  (info->ctx).fps_in_flex = pMVar10->fps_in_flex;
  (info->ctx).fps_in_den = RVar13;
  (info->ctx).fps_in_num = RVar12;
  (info->ctx).fps_out_flex = RVar14;
  uVar1 = pMVar10->fps_out_num;
  uVar2 = pMVar10->fps_out_den;
  (info->ctx).fps_out_den = uVar2;
  (info->ctx).fps_out_num = uVar1;
  (info->ctx).scene_mode = pMVar10->scene_mode;
  RVar13 = pMVar10->atr_str_i;
  RVar14 = pMVar10->atr_str_p;
  RVar12 = pMVar10->anti_flicker_str;
  (info->ctx).cu_qp_delta_depth = pMVar10->cu_qp_delta_depth;
  (info->ctx).anti_flicker_str = RVar12;
  (info->ctx).atr_str_i = RVar13;
  (info->ctx).atr_str_p = RVar14;
  RVar12 = pMVar10->sao_str_i;
  (info->ctx).atl_str = pMVar10->atl_str;
  (info->ctx).sao_str_i = RVar12;
  (info->ctx).sao_str_p = pMVar10->sao_str_p;
  iVar15 = mpp_get_soc_type();
  RVar7 = (info->ctx).hor_stride;
  RVar8 = (info->ctx).ver_stride;
  if (iVar15 == 0x16) {
    iVar15 = (RVar7 + 0x3f >> 1 & 0xffffffe0) * (RVar8 + 0x3f >> 6);
  }
  else {
    bVar24 = MVar22 == MPP_VIDEO_CodingHEVC;
    iVar15 = (RVar8 + (uint)bVar24 * 0x10 + 0xf >> (bVar24 | 4U)) *
             (RVar7 + (uint)!bVar24 * 0x20 + 0x1f >> (6U - bVar24 & 0x1f)) * 0x10;
  }
  (info->ctx).mdinfo_size = (long)iVar15;
  __s1 = pMVar10->file_input;
  if (__s1 != (char *)0x0) {
    iVar15 = strncmp(__s1,"/dev/video",10);
    if (iVar15 == 0) {
      _mpp_log_l(4,"mpi_enc_test","open camera device",0);
      pCVar18 = camera_source_init(pMVar10->file_input,4,(info->ctx).width,(info->ctx).height,
                                   (info->ctx).fmt);
      (info->ctx).cam_ctx = pCVar18;
      _mpp_log_l(4,"mpi_enc_test","new framecap ok",0);
      if ((info->ctx).cam_ctx == (CamSource *)0x0) {
        _mpp_log_l(2,"mpi_enc_test","open %s fail",0,pMVar10->file_input);
      }
    }
    else {
      pFVar17 = fopen(__s1,"rb");
      (info->ctx).fp_input = (FILE *)pFVar17;
      if (pFVar17 == (FILE *)0x0) {
        _mpp_log_l(2,"mpi_enc_test","failed to open input file %s\n",0,pMVar10->file_input);
        _mpp_log_l(2,"mpi_enc_test","create default yuv image for test\n",0);
      }
    }
  }
  MVar23 = MPP_OK;
  if (pMVar10->file_output != (char *)0x0) {
    pFVar17 = fopen(pMVar10->file_output,"w+b");
    (info->ctx).fp_output = (FILE *)pFVar17;
    if (pFVar17 == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_test","failed to open output file %s\n",0,pMVar10->file_output);
      MVar23 = MPP_ERR_OPEN_FILE;
    }
  }
  if (pMVar10->file_slt != (char *)0x0) {
    pFVar17 = fopen(pMVar10->file_slt,"wt");
    (info->ctx).fp_verify = (FILE *)pFVar17;
    if (pFVar17 == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_test","failed to open verify file %s\n",0,pMVar10->file_slt);
    }
  }
  MVar16 = (info->ctx).fmt;
  MVar19 = MVar16 & 0xfffff;
  if (MVar19 - MPP_FMT_RGB565 < 0xe) {
LAB_00106d98:
    uVar21 = (info->ctx).hor_stride + 0x3f & 0xffffffc0;
    uVar20 = (info->ctx).ver_stride + 0x3f & 0x3ffffc0;
  }
  else {
    if (MVar19 < MPP_FMT_YUV440SP) {
      if ((0xf44U >> (MVar16 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) {
        uVar21 = (info->ctx).ver_stride + 0x3f & 0x7fffffc0;
        uVar20 = (info->ctx).hor_stride * 2 + 0x7e & 0x3ffff80;
        goto LAB_00106dee;
      }
      if ((0x11U >> (MVar16 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) {
        uVar20 = ((info->ctx).ver_stride + 0x3f & 0xffffffc0) *
                 ((info->ctx).hor_stride + 0x3f & 0x3ffffc0) * 3 >> 1;
        goto LAB_00106df1;
      }
      if (MVar19 == MPP_FMT_YUV400) goto LAB_00106d98;
    }
    uVar21 = (info->ctx).ver_stride + 0x3f & 0x3fffffc0;
    uVar20 = (info->ctx).hor_stride * 4 + 0xfc & 0x3ffff00;
  }
LAB_00106dee:
  uVar20 = uVar20 * uVar21;
LAB_00106df1:
  (info->ctx).frame_size = (ulong)uVar20;
  MVar16 = MVar16 & 0xf00000;
  if (MVar16 != MPP_FMT_YUV420SP) {
    if (MVar16 == 0x100000) {
      MVar16 = (((info->ctx).height + 0xf & 0xffffff0) * ((info->ctx).width + 0xf & 0xfffffff0) >> 4
               ) + 0xfff & 0x1ffff000;
    }
    else {
      MVar16 = ((info->ctx).height + 0xf & 0xffffff0) * ((info->ctx).width + 0xf & 0xfffffff0) >> 4;
    }
  }
  (info->ctx).header_size = (ulong)MVar16;
  return MVar23;
}

Assistant:

MPP_RET test_ctx_init(MpiEncMultiCtxInfo *info)
{
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncTestData *p = &info->ctx;
    MPP_RET ret = MPP_OK;

    // get paramter from cmd
    p->width        = cmd->width;
    p->height       = cmd->height;
    p->hor_stride   = (cmd->hor_stride) ? (cmd->hor_stride) :
                      (MPP_ALIGN(cmd->width, 16));
    p->ver_stride   = (cmd->ver_stride) ? (cmd->ver_stride) :
                      (MPP_ALIGN(cmd->height, 16));
    p->fmt          = cmd->format;
    p->type         = cmd->type;
    p->bps          = cmd->bps_target;
    p->bps_min      = cmd->bps_min;
    p->bps_max      = cmd->bps_max;
    p->rc_mode      = cmd->rc_mode;
    p->frame_num    = cmd->frame_num;
    if (cmd->type == MPP_VIDEO_CodingMJPEG && p->frame_num == 0) {
        mpp_log("jpege default encode only one frame. Use -n [num] for rc case\n");
        p->frame_num = 1;
    }
    p->gop_mode     = cmd->gop_mode;
    p->gop_len      = cmd->gop_len;
    p->vi_len       = cmd->vi_len;
    p->fps_in_flex  = cmd->fps_in_flex;
    p->fps_in_den   = cmd->fps_in_den;
    p->fps_in_num   = cmd->fps_in_num;
    p->fps_out_flex = cmd->fps_out_flex;
    p->fps_out_den  = cmd->fps_out_den;
    p->fps_out_num  = cmd->fps_out_num;
    p->scene_mode   = cmd->scene_mode;
    p->cu_qp_delta_depth = cmd->cu_qp_delta_depth;
    p->anti_flicker_str = cmd->anti_flicker_str;
    p->atr_str_i = cmd->atr_str_i;
    p->atr_str_p = cmd->atr_str_p;
    p->atl_str = cmd->atl_str;
    p->sao_str_i = cmd->sao_str_i;
    p->sao_str_p = cmd->sao_str_p;
    p->mdinfo_size  = get_mdinfo_size(p, cmd->type);

    if (cmd->file_input) {
        if (!strncmp(cmd->file_input, "/dev/video", 10)) {
            mpp_log("open camera device");
            p->cam_ctx = camera_source_init(cmd->file_input, 4, p->width, p->height, p->fmt);
            mpp_log("new framecap ok");
            if (p->cam_ctx == NULL)
                mpp_err("open %s fail", cmd->file_input);
        } else {
            p->fp_input = fopen(cmd->file_input, "rb");
            if (NULL == p->fp_input) {
                mpp_err("failed to open input file %s\n", cmd->file_input);
                mpp_err("create default yuv image for test\n");
            }
        }
    }

    if (cmd->file_output) {
        p->fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == p->fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            ret = MPP_ERR_OPEN_FILE;
        }
    }

    if (cmd->file_slt) {
        p->fp_verify = fopen(cmd->file_slt, "wt");
        if (!p->fp_verify)
            mpp_err("failed to open verify file %s\n", cmd->file_slt);
    }

    // update resource parameter
    switch (p->fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 3 / 2;
    } break;

    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY :
    case MPP_FMT_YUV422P :
    case MPP_FMT_YUV422SP : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 2;
    } break;
    case MPP_FMT_YUV400:
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64);
    } break;

    default: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 4;
    } break;
    }

    if (MPP_FRAME_FMT_IS_FBC(p->fmt)) {
        if ((p->fmt & MPP_FRAME_FBC_MASK) == MPP_FRAME_FBC_AFBC_V1)
            p->header_size = MPP_ALIGN(MPP_ALIGN(p->width, 16) * MPP_ALIGN(p->height, 16) / 16, SZ_4K);
        else
            p->header_size = MPP_ALIGN(p->width, 16) * MPP_ALIGN(p->height, 16) / 16;
    } else {
        p->header_size = 0;
    }

    return ret;
}